

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackTraceTest.cpp
# Opt level: O3

void __thiscall
StackTraceTest_getStackTrace_Test::~StackTraceTest_getStackTrace_Test
          (StackTraceTest_getStackTrace_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(StackTraceTest, getStackTrace)
{
    StackTrace frames = StackTrace::getStackTrace();
    EXPECT_TRUE(frames.size()>0);
    for(std::size_t i=0; i<frames.size(); ++i) {
         std::cout<<"Frame "<<i<<": "<<frames[i].getSymbol()<<std::endl;
    }
    const std::string functionName(frames[0].getSymbol());
    std::cout<<functionName<<std::endl;
    EXPECT_TRUE(functionName.find("getStackTrace")!=std::string::npos);
}